

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::SetMaterial
          (ChElementBeamANCF_3243 *this,shared_ptr<chrono::fea::ChMaterialBeamANCF> *beam_mat)

{
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>,
             &beam_mat->
              super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->m_method == PreInt) &&
     (0 < (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows)) {
    PrecomputeInternalForceMatricesWeights(this);
    return;
  }
  return;
}

Assistant:

void ChElementBeamANCF_3243::SetMaterial(std::shared_ptr<ChMaterialBeamANCF> beam_mat) {
    m_material = beam_mat;

    // Check to see if the Pre-Integration method is selected and if the precomputed matrices have already been
    // generated and thus need to be regenerated.  The Continuous Integration precomputed matrices do not include any
    // material properties.
    if (m_method == IntFrcMethod::PreInt) {
        if (m_O1.size() > 0) {
            PrecomputeInternalForceMatricesWeights();
        }
    }
}